

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles2::Functional::createCaseGroup
               (TestCaseGroup *parent,char *groupName,char *groupDesc,TexFuncCaseSpec *cases,
               int numCases,bool isVertex)

{
  size_type *evaluator;
  Context *pCVar1;
  char *name;
  undefined8 uVar2;
  undefined8 uVar3;
  TestNode *node;
  ShaderRenderCase *this;
  long lVar4;
  undefined4 *puVar5;
  string *psVar6;
  long lVar7;
  byte bVar8;
  
  bVar8 = 0;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(parent->super_TestCaseGroup).super_TestNode.m_testCtx,groupName,
             groupDesc);
  tcu::TestNode::addChild((TestNode *)parent,node);
  lVar7 = 0;
  do {
    this = (ShaderRenderCase *)operator_new(0x200);
    pCVar1 = parent->m_context;
    name = *(char **)((long)(cases->lookupSpec).minCoord.m_data + lVar7 + -0xc);
    uVar2 = *(undefined8 *)((long)&cases->evalFunc + lVar7);
    (this->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderTextureFunctionCase_0212b1f8;
    evaluator = &this[1].m_vertShaderSource._M_string_length;
    deqp::gls::ShaderRenderCase::ShaderRenderCase
              (this,pCVar1->m_testCtx,pCVar1->m_renderCtx,pCVar1->m_contextInfo,name,
               ::glcts::fixed_sample_locations_values + 1,SUB41(numCases,0),
               (ShaderEvaluator *)evaluator);
    (this->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderTextureFunctionCase_0212b1f8;
    *(undefined4 *)&this[1].super_TestCase.super_TestNode._vptr_TestNode =
         *(undefined4 *)((long)(cases->lookupSpec).minCoord.m_data + lVar7 + -4);
    uVar3 = *(undefined8 *)((long)(cases->lookupSpec).minCoord.m_data + lVar7 + 8);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
         *(undefined8 *)((long)(cases->lookupSpec).minCoord.m_data + lVar7);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_testCtx + 4) = uVar3;
    uVar3 = *(undefined8 *)((long)(cases->lookupSpec).maxCoord.m_data + lVar7 + 8);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
         *(undefined8 *)((long)(cases->lookupSpec).maxCoord.m_data + lVar7);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
         uVar3;
    *(undefined4 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) =
         *(undefined4 *)((long)(&(cases->lookupSpec).maxCoord + 1) + lVar7 + 8);
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 4) =
         *(undefined8 *)((long)(&(cases->lookupSpec).maxCoord + 1) + lVar7);
    puVar5 = (undefined4 *)((long)&((TextureSpec *)(&cases->lookupSpec + 1))->type + lVar7);
    psVar6 = &this[1].super_TestCase.super_TestNode.m_description;
    for (lVar4 = 0x15; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)&(psVar6->_M_dataplus)._M_p = *puVar5;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      psVar6 = (string *)((long)psVar6 + (ulong)bVar8 * -8 + 4);
    }
    *(undefined4 *)&this[1].field_0x84 = 0;
    this[1].m_defaultEvaluator._vptr_ShaderEvaluator = (_func_int **)0x3f8000003f800000;
    this[1].m_defaultEvaluator.m_evalFunc = (ShaderEvalFunc)0x3f8000003f800000;
    this[1].m_evaluator = (ShaderEvaluator *)0x0;
    this[1].m_vertShaderSource._M_dataplus._M_p = (pointer)0x0;
    deqp::gls::ShaderEvaluator::ShaderEvaluator((ShaderEvaluator *)evaluator);
    this[1].m_vertShaderSource._M_string_length = (size_type)&PTR__ShaderEvaluator_0212b2b0;
    *(undefined8 *)((long)&this[1].m_vertShaderSource.field_2 + 8) = uVar2;
    this[1].m_fragShaderSource._M_dataplus._M_p = &this[1].field_0x84;
    this[1].m_fragShaderSource._M_string_length = 0;
    this[1].m_fragShaderSource.field_2._M_allocated_capacity = 0;
    tcu::TestNode::addChild(node,(TestNode *)this);
    lVar7 = lVar7 + 0x98;
  } while (lVar7 != 0x4c0);
  return;
}

Assistant:

static void createCaseGroup (TestCaseGroup* parent, const char* groupName, const char* groupDesc, const TexFuncCaseSpec* cases, int numCases, bool isVertex)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(parent->getTestContext(), groupName, groupDesc);
	parent->addChild(group);

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new ShaderTextureFunctionCase(parent->getContext(), cases[ndx].name, "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, isVertex));
}